

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  ulong uVar1;
  ostream *this_00;
  long in_RDI;
  string *in_R8;
  stringstream ss;
  string *in_stack_00000b90;
  string *in_stack_00000b98;
  istream *in_stack_00000ba0;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_stack_00000ba8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000bb0;
  string local_1f0 [48];
  stringstream local_1c0 [16];
  ostream local_1b0 [384];
  string *local_30;
  byte local_1;
  
  local_30 = in_R8;
  uVar1 = std::ios::operator!((ios *)((long)*(long **)(in_RDI + 8) +
                                     *(long *)(**(long **)(in_RDI + 8) + -0x18)));
  if ((uVar1 & 1) == 0) {
    LoadMtl(in_stack_00000bb0,in_stack_00000ba8,in_stack_00000ba0,in_stack_00000b98,
            in_stack_00000b90);
    local_1 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c0);
    this_00 = std::operator<<(local_1b0,"Material stream in error state. ");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (local_30 != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_30,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
    local_1 = 0;
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *warn, std::string *err) {
  (void)err;
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "Material stream in error state. " << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;
  }

  LoadMtl(matMap, materials, &m_inStream, warn, err);

  return true;
}